

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

int __thiscall
CVmObjBigNum::setup_getp_retval
          (CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,char **new_ext,size_t prec)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  vm_obj_id_t vVar3;
  bool bVar4;
  
  pvVar2 = sp_;
  bVar4 = ((this->super_CVmObject).ext_[4] & 6U) == 0;
  if (bVar4) {
    pvVar1 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar1 = VM_OBJ;
    (pvVar2->val).obj = self;
    vVar3 = create(0,prec);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar3;
    *new_ext = *(char **)((long)&G_obj_table_X.pages_[vVar3 >> 0xc][vVar3 & 0xfff].ptr_ + 8);
  }
  else {
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
  }
  return (uint)!bVar4;
}

Assistant:

int CVmObjBigNum::setup_getp_retval(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, char **new_ext,
                                    size_t prec)
{
    /* if I'm not a number, return myself unchanged */
    if (is_nan(ext_))
    {
        retval->set_obj(self);
        return TRUE;
    }

    /* push a self-reference while we're working */
    G_stk->push()->set_obj(self);

    /* create a new number with the same precision as the original */
    retval->set_obj(create(vmg_ FALSE, prec));
    *new_ext = get_objid_ext(vmg_ retval->val.obj);

    /* tell the caller to proceed */
    return FALSE;
}